

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_add_asn1_oid_from_text(CBB *cbb,char *text,size_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t a;
  uint64_t b;
  CBS cbs;
  ulong local_40;
  ulong local_38;
  CBS local_30;
  
  iVar1 = CBB_flush(cbb);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_30.data = (uint8_t *)text;
    local_30.len = len;
    iVar2 = parse_dotted_decimal(&local_30,&local_40);
    iVar3 = 0;
    iVar1 = 0;
    if ((((iVar2 != 0) &&
         (iVar2 = parse_dotted_decimal(&local_30,&local_38), iVar1 = iVar3, iVar2 != 0)) &&
        (local_40 < 3)) &&
       ((local_38 < 0xffffffffffffffb0 && (local_38 < 0x28 || local_40 == 2) &&
        (iVar2 = add_base128_integer(cbb,local_38 + local_40 * 0x28), iVar2 != 0)))) {
      while (local_30.len != 0) {
        iVar1 = parse_dotted_decimal(&local_30,&local_40);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = add_base128_integer(cbb,local_40);
        if (iVar1 == 0) {
          return 0;
        }
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int CBB_add_asn1_oid_from_text(CBB *cbb, const char *text, size_t len) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)text, len);

  // OIDs must have at least two components.
  uint64_t a, b;
  if (!parse_dotted_decimal(&cbs, &a) || !parse_dotted_decimal(&cbs, &b)) {
    return 0;
  }

  // The first component is encoded as 40 * |a| + |b|. This assumes that |a| is
  // 0, 1, or 2 and that, when it is 0 or 1, |b| is at most 39.
  if (a > 2 || (a < 2 && b > 39) || b > UINT64_MAX - 80 ||
      !add_base128_integer(cbb, 40u * a + b)) {
    return 0;
  }

  // The remaining components are encoded unmodified.
  while (CBS_len(&cbs) > 0) {
    if (!parse_dotted_decimal(&cbs, &a) || !add_base128_integer(cbb, a)) {
      return 0;
    }
  }

  return 1;
}